

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.h
# Opt level: O0

void __thiscall vmgram_tok_info::~vmgram_tok_info(vmgram_tok_info *this)

{
  long in_RDI;
  
  if (*(char *)(in_RDI + 2) == '\x03') {
    free(*(void **)(in_RDI + 8));
  }
  else if (*(char *)(in_RDI + 2) == '\x06') {
    free(*(void **)(in_RDI + 0x10));
  }
  return;
}

Assistant:

~vmgram_tok_info()
    {
        switch (typ)
        {
        case VMGRAM_MATCH_LITERAL:
            t3free(typinfo.lit.str);
            break;

        case VMGRAM_MATCH_NSPEECH:
            t3free(typinfo.nspeech.props);
            break;
        }
    }